

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O2

_Bool test_permute_cols(void)

{
  int *piVar1;
  uint n;
  long lVar2;
  ulong uVar3;
  int c;
  uint8_t *memory;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  uint8_t *puVar7;
  char *pcVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  int *arr;
  uint8_t auStack_50 [8];
  undefined1 local_48 [8];
  m256v A;
  
  for (uVar9 = 0; uVar9 != 7; uVar9 = uVar9 + 1) {
    n = (&DAT_001046d0)[uVar9];
    uVar10 = (ulong)n;
    lVar2 = -(uVar10 * 4 + 0xf & 0xfffffffffffffff0);
    arr = (int *)(local_48 + lVar2);
    puVar7 = auStack_50 + lVar2;
    puVar7[0] = 0xeb;
    puVar7[1] = '\x1e';
    puVar7[2] = '\x10';
    puVar7[3] = '\0';
    puVar7[4] = '\0';
    puVar7[5] = '\0';
    puVar7[6] = '\0';
    puVar7[7] = '\0';
    perm_rand(n,arr);
    memory = (uint8_t *)((long)arr - (ulong)(n * n + 0xf & 0xfffffff0));
    builtin_memcpy(memory + -8,"\x0f\x1f\x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_make((m256v *)local_48,n,n,memory);
    uVar6 = uVar10;
    if ((int)n < 1) {
      uVar6 = 0;
    }
    for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(bool *)(uVar4 + A._0_8_ * uVar3 + A.rstride) = uVar3 == uVar4;
      }
    }
    builtin_memcpy(memory + -8,"T\x1f\x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_permute_cols((m256v *)local_48,arr);
    pcVar5 = (char *)A.rstride;
    uVar3 = 0;
    while (uVar3 != uVar6) {
      pcVar8 = pcVar5;
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        if (*pcVar8 != '\0') goto LAB_00101f7d;
        pcVar8 = pcVar8 + A._0_8_;
      }
      uVar4 = (ulong)n;
LAB_00101f7d:
      pcVar5 = pcVar5 + 1;
      piVar1 = arr + uVar3;
      uVar3 = uVar3 + 1;
      if ((int)uVar4 != *piVar1) goto LAB_00101fa4;
    }
  }
LAB_00101fa4:
  return 6 < uVar9;
}

Assistant:

static bool test_permute_cols()
{
	const int rowscols[] = { 1, 2, 3, 5, 8, 10, 15 };
	for (int i = 0; i < array_size(rowscols); ++i) {
		const int rc = rowscols[i];

		/* Generate a random permutation */
		int p[rc];
		perm_rand(rc, p);

		/* Generate identity matrix */
		m256v_Def(A, a, rc, rc);
		for (int r = 0; r < rc; ++r) {
			for (int c = 0; c < rc; ++c) {
				m256v_set_el(&A, r, c, r==c);
			}
		}

		/* Apply perm */
		m256v_permute_cols(&A, p);

		/* Check output is as expected */
		for (int c = 0; c < rc; ++c) {
			int j;
			for (j = 0; j < rc; ++j) {
				if (m256v_get_el(&A, j, c))
					break;
			}

			if (j != p[c])
				return false;
		}
	}

	return true;
}